

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

void __thiscall
JsrtDebuggerObjectsManager::~JsrtDebuggerObjectsManager(JsrtDebuggerObjectsManager *this)

{
  DataToDebuggerObjectsDictionary *pDVar1;
  DebuggerObjectsDictionary *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ArenaAllocator *pAVar6;
  
  pDVar1 = this->dataToDebuggerObjectsDictionary;
  if (pDVar1 != (DataToDebuggerObjectsDictionary *)0x0) {
    if (pDVar1->count != pDVar1->freeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                         ,0x86,"(this->dataToDebuggerObjectsDictionary->Count() == 0)",
                         "Should have cleared all debugger objects by now?");
      if (!bVar4) goto LAB_0039a00f;
      *puVar5 = 0;
    }
    pAVar6 = GetDebugObjectArena(this);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (pAVar6,this->dataToDebuggerObjectsDictionary);
    this->dataToDebuggerObjectsDictionary = (DataToDebuggerObjectsDictionary *)0x0;
  }
  pDVar2 = this->handleToDebuggerObjectsDictionary;
  if (pDVar2 != (DebuggerObjectsDictionary *)0x0) {
    if (pDVar2->count != pDVar2->freeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                         ,0x8e,"(this->handleToDebuggerObjectsDictionary->Count() == 0)",
                         "Should have cleared all handle by now?");
      if (!bVar4) {
LAB_0039a00f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pAVar6 = GetDebugObjectArena(this);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<unsigned_int,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (pAVar6,this->handleToDebuggerObjectsDictionary);
    this->handleToDebuggerObjectsDictionary = (DebuggerObjectsDictionary *)0x0;
  }
  return;
}

Assistant:

JsrtDebuggerObjectsManager::~JsrtDebuggerObjectsManager()
{
    if (this->dataToDebuggerObjectsDictionary != nullptr)
    {
        AssertMsg(this->dataToDebuggerObjectsDictionary->Count() == 0, "Should have cleared all debugger objects by now?");

        Adelete(this->GetDebugObjectArena(), this->dataToDebuggerObjectsDictionary);
        this->dataToDebuggerObjectsDictionary = nullptr;
    }

    if (this->handleToDebuggerObjectsDictionary != nullptr)
    {
        AssertMsg(this->handleToDebuggerObjectsDictionary->Count() == 0, "Should have cleared all handle by now?");

        Adelete(this->GetDebugObjectArena(), this->handleToDebuggerObjectsDictionary);
        this->handleToDebuggerObjectsDictionary = nullptr;
    }
}